

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O3

CURLcode ftp_state_pasv_resp(connectdata *conn,int ftpcode)

{
  char *pcVar1;
  uint uVar2;
  int iVar3;
  CURLcode CVar4;
  long lVar5;
  uint uVar6;
  uint in_R8D;
  uint in_R9D;
  Curl_easy *data;
  ulong uVar7;
  char *pcVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  char separator [4];
  Curl_dns_entry *addr;
  uint num;
  undefined4 local_160;
  uint local_15c;
  Curl_dns_entry *local_158;
  int local_14c;
  Curl_easy *local_148;
  connectdata *local_140;
  uint local_138;
  uint local_134;
  uint local_130;
  uint local_12c [63];
  
  data = conn->data;
  local_158 = (Curl_dns_entry *)0x0;
  pcVar8 = (data->state).buffer + 4;
  (*Curl_cfree)((conn->proto).ftpc.newhost);
  (conn->proto).ftpc.newhost = (char *)0x0;
  uVar2 = (conn->proto).ftpc.count1;
  if (ftpcode != 0xe5 || uVar2 != 0) {
    uVar6 = uVar2 ^ 1;
    if (ftpcode != 0xe3 || uVar6 != 0) {
      if (uVar2 != 0) {
        Curl_failf(data,"Bad PASV/EPSV response: %03d",(ulong)(uint)ftpcode);
        return CURLE_FTP_WEIRD_PASV_REPLY;
      }
      CVar4 = ftp_epsv_disable(conn);
      return CVar4;
    }
    if (*pcVar8 == '\0') {
      bVar11 = true;
      bVar10 = false;
      bVar9 = false;
      local_138 = 0;
    }
    else {
      local_14c = ftpcode;
      local_148 = data;
      local_140 = conn;
      do {
        iVar3 = __isoc99_sscanf(pcVar8,"%u,%u,%u,%u,%u,%u",&local_138,&local_134,&local_130,
                                local_12c,&local_160,&local_15c);
        if (iVar3 == 6) {
          bVar11 = *pcVar8 == '\0';
          goto LAB_00117615;
        }
        pcVar1 = pcVar8 + 1;
        pcVar8 = pcVar8 + 1;
      } while (*pcVar1 != '\0');
      bVar11 = true;
LAB_00117615:
      bVar9 = 0xff < local_160;
      bVar10 = 0xff < local_15c;
      conn = local_140;
      data = local_148;
      ftpcode = local_14c;
      in_R8D = local_130;
      in_R9D = local_12c[0];
      uVar6 = local_134;
    }
    if (((((bVar11) || (0xff < local_138)) || (0xff < uVar6)) ||
        ((0xff < in_R8D || (0xff < in_R9D)))) || ((bVar9 || (bVar10)))) {
      Curl_failf(data,"Couldn\'t interpret the 227-response");
      return CURLE_FTP_WEIRD_227_FORMAT;
    }
    if ((data->set).ftp_skip_ip == true) {
      Curl_infof(data,"Skip %u.%u.%u.%u for data connection, re-use %s instead\n");
      if (((conn->bits).tunnel_proxy == false) && ((conn->bits).socksproxy != true)) {
        pcVar8 = conn->ip_addr_str;
      }
      else {
        pcVar8 = (conn->host).name;
      }
      pcVar8 = (*Curl_cstrdup)(pcVar8);
    }
    else {
      pcVar8 = curl_maprintf("%u.%u.%u.%u",(ulong)local_138,(ulong)uVar6,(ulong)in_R8D,(ulong)in_R9D
                            );
    }
    (conn->proto).ftpc.newhost = pcVar8;
    if (pcVar8 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    (conn->proto).ftpc.newport = (short)(local_160 << 8) + (short)local_15c;
LAB_00117754:
    if ((conn->bits).proxy == true) {
      pcVar8 = *(char **)((long)&(conn->socks_proxy).host.name +
                         (ulong)(((conn->bits).socksproxy ^ 1) << 6));
      iVar3 = Curl_resolv(conn,pcVar8,(int)conn->port,&local_158);
      if (iVar3 == 1) {
        Curl_resolver_wait_resolv(conn,&local_158);
      }
      uVar7 = conn->port;
      if (local_158 == (Curl_dns_entry *)0x0) {
        Curl_failf(data,"Can\'t resolve proxy host %s:%hu",pcVar8,uVar7 & 0xffff);
        return CURLE_COULDNT_RESOLVE_PROXY;
      }
    }
    else {
      iVar3 = Curl_resolv(conn,pcVar8,(uint)(conn->proto).ftpc.newport,&local_158);
      if (iVar3 == 1) {
        Curl_resolver_wait_resolv(conn,&local_158);
      }
      uVar7 = (ulong)(conn->proto).ftpc.newport;
      if (local_158 == (Curl_dns_entry *)0x0) {
        Curl_failf(data,"Can\'t resolve new host %s:%hu",(conn->proto).ftpc.newhost,uVar7);
        return CURLE_FTP_CANT_GET_HOST;
      }
    }
    (conn->bits).tcpconnect[1] = false;
    CVar4 = Curl_connecthost(conn,local_158);
    if (CVar4 == CURLE_OK) {
      if ((data->set).verbose == true) {
        pcVar8 = (conn->proto).ftpc.newhost;
        Curl_printable_address(local_158->addr,(char *)&local_138,0x100);
        Curl_infof(conn->data,"Connecting to %s (%s) port %d\n",pcVar8,&local_138,uVar7 & 0xffff);
      }
      Curl_resolv_unlock(data,local_158);
      (*Curl_cfree)(conn->secondaryhostname);
      conn->secondaryhostname = (char *)0x0;
      conn->secondary_port = (conn->proto).ftpc.newport;
      pcVar8 = (*Curl_cstrdup)((conn->proto).ftpc.newhost);
      conn->secondaryhostname = pcVar8;
      if (pcVar8 == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      (conn->bits).do_more = true;
      (conn->proto).ftpc.state = FTP_STOP;
      return CURLE_OK;
    }
    Curl_resolv_unlock(data,local_158);
    if (ftpcode != 0xe5) {
      return CVar4;
    }
    if ((conn->proto).ftpc.count1 == 0) {
      CVar4 = ftp_epsv_disable(conn);
      return CVar4;
    }
    return CVar4;
  }
  pcVar8 = strchr(pcVar8,0x28);
  if ((pcVar8 == (char *)0x0) ||
     (iVar3 = __isoc99_sscanf(pcVar8 + 1,"%c%c%c%u%c",&local_160,(long)&local_160 + 1,
                              (long)&local_160 + 2,&local_138,(long)&local_160 + 3), iVar3 != 5)) {
LAB_001175e1:
    pcVar8 = "Weirdly formatted EPSV reply";
  }
  else {
    lVar5 = 1;
    do {
      if (*(char *)((long)&local_160 + lVar5) != (char)local_160) {
        if (0xffff < local_138) goto LAB_001175d8;
        goto LAB_001175e1;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != 4);
    if (local_138 < 0x10000) {
      (conn->proto).ftpc.newport = (unsigned_short)local_138;
      if (((conn->bits).tunnel_proxy == false) && ((conn->bits).socksproxy != true)) {
        pcVar8 = conn->ip_addr_str;
      }
      else {
        pcVar8 = (conn->host).name;
      }
      pcVar8 = (*Curl_cstrdup)(pcVar8);
      (conn->proto).ftpc.newhost = pcVar8;
      if (pcVar8 == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      goto LAB_00117754;
    }
LAB_001175d8:
    pcVar8 = "Illegal port number in EPSV reply";
  }
  Curl_failf(data,pcVar8);
  return CURLE_FTP_WEIRD_PASV_REPLY;
}

Assistant:

static CURLcode ftp_state_pasv_resp(struct connectdata *conn,
                                    int ftpcode)
{
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  CURLcode result;
  struct Curl_easy *data = conn->data;
  struct Curl_dns_entry *addr = NULL;
  int rc;
  unsigned short connectport; /* the local port connect() should use! */
  char *str = &data->state.buffer[4];  /* start on the first letter */

  /* if we come here again, make sure the former name is cleared */
  Curl_safefree(ftpc->newhost);

  if((ftpc->count1 == 0) &&
     (ftpcode == 229)) {
    /* positive EPSV response */
    char *ptr = strchr(str, '(');
    if(ptr) {
      unsigned int num;
      char separator[4];
      ptr++;
      if(5 == sscanf(ptr, "%c%c%c%u%c",
                     &separator[0],
                     &separator[1],
                     &separator[2],
                     &num,
                     &separator[3])) {
        const char sep1 = separator[0];
        int i;

        /* The four separators should be identical, or else this is an oddly
           formatted reply and we bail out immediately. */
        for(i = 1; i<4; i++) {
          if(separator[i] != sep1) {
            ptr = NULL; /* set to NULL to signal error */
            break;
          }
        }
        if(num > 0xffff) {
          failf(data, "Illegal port number in EPSV reply");
          return CURLE_FTP_WEIRD_PASV_REPLY;
        }
        if(ptr) {
          ftpc->newport = (unsigned short)(num & 0xffff);
          ftpc->newhost = strdup(control_address(conn));
          if(!ftpc->newhost)
            return CURLE_OUT_OF_MEMORY;
        }
      }
      else
        ptr = NULL;
    }
    if(!ptr) {
      failf(data, "Weirdly formatted EPSV reply");
      return CURLE_FTP_WEIRD_PASV_REPLY;
    }
  }
  else if((ftpc->count1 == 1) &&
          (ftpcode == 227)) {
    /* positive PASV response */
    unsigned int ip[4];
    unsigned int port[2];

    /*
     * Scan for a sequence of six comma-separated numbers and use them as
     * IP+port indicators.
     *
     * Found reply-strings include:
     * "227 Entering Passive Mode (127,0,0,1,4,51)"
     * "227 Data transfer will passively listen to 127,0,0,1,4,51"
     * "227 Entering passive mode. 127,0,0,1,4,51"
     */
    while(*str) {
      if(6 == sscanf(str, "%u,%u,%u,%u,%u,%u",
                     &ip[0], &ip[1], &ip[2], &ip[3],
                     &port[0], &port[1]))
        break;
      str++;
    }

    if(!*str || (ip[0] > 255) || (ip[1] > 255)  || (ip[2] > 255)  ||
       (ip[3] > 255) || (port[0] > 255)  || (port[1] > 255) ) {
      failf(data, "Couldn't interpret the 227-response");
      return CURLE_FTP_WEIRD_227_FORMAT;
    }

    /* we got OK from server */
    if(data->set.ftp_skip_ip) {
      /* told to ignore the remotely given IP but instead use the host we used
         for the control connection */
      infof(data, "Skip %u.%u.%u.%u for data connection, re-use %s instead\n",
            ip[0], ip[1], ip[2], ip[3],
            conn->host.name);
      ftpc->newhost = strdup(control_address(conn));
    }
    else
      ftpc->newhost = aprintf("%u.%u.%u.%u", ip[0], ip[1], ip[2], ip[3]);

    if(!ftpc->newhost)
      return CURLE_OUT_OF_MEMORY;

    ftpc->newport = (unsigned short)(((port[0]<<8) + port[1]) & 0xffff);
  }
  else if(ftpc->count1 == 0) {
    /* EPSV failed, move on to PASV */
    return ftp_epsv_disable(conn);
  }
  else {
    failf(data, "Bad PASV/EPSV response: %03d", ftpcode);
    return CURLE_FTP_WEIRD_PASV_REPLY;
  }

  if(conn->bits.proxy) {
    /*
     * This connection uses a proxy and we need to connect to the proxy again
     * here. We don't want to rely on a former host lookup that might've
     * expired now, instead we remake the lookup here and now!
     */
    const char * const host_name = conn->bits.socksproxy ?
      conn->socks_proxy.host.name : conn->http_proxy.host.name;
    rc = Curl_resolv(conn, host_name, (int)conn->port, &addr);
    if(rc == CURLRESOLV_PENDING)
      /* BLOCKING, ignores the return code but 'addr' will be NULL in
         case of failure */
      (void)Curl_resolver_wait_resolv(conn, &addr);

    connectport =
      (unsigned short)conn->port; /* we connect to the proxy's port */

    if(!addr) {
      failf(data, "Can't resolve proxy host %s:%hu", host_name, connectport);
      return CURLE_COULDNT_RESOLVE_PROXY;
    }
  }
  else {
    /* normal, direct, ftp connection */
    rc = Curl_resolv(conn, ftpc->newhost, ftpc->newport, &addr);
    if(rc == CURLRESOLV_PENDING)
      /* BLOCKING */
      (void)Curl_resolver_wait_resolv(conn, &addr);

    connectport = ftpc->newport; /* we connect to the remote port */

    if(!addr) {
      failf(data, "Can't resolve new host %s:%hu", ftpc->newhost, connectport);
      return CURLE_FTP_CANT_GET_HOST;
    }
  }

  conn->bits.tcpconnect[SECONDARYSOCKET] = FALSE;
  result = Curl_connecthost(conn, addr);

  if(result) {
    Curl_resolv_unlock(data, addr); /* we're done using this address */
    if(ftpc->count1 == 0 && ftpcode == 229)
      return ftp_epsv_disable(conn);

    return result;
  }


  /*
   * When this is used from the multi interface, this might've returned with
   * the 'connected' set to FALSE and thus we are now awaiting a non-blocking
   * connect to connect.
   */

  if(data->set.verbose)
    /* this just dumps information about this second connection */
    ftp_pasv_verbose(conn, addr->addr, ftpc->newhost, connectport);

  Curl_resolv_unlock(data, addr); /* we're done using this address */

  Curl_safefree(conn->secondaryhostname);
  conn->secondary_port = ftpc->newport;
  conn->secondaryhostname = strdup(ftpc->newhost);
  if(!conn->secondaryhostname)
    return CURLE_OUT_OF_MEMORY;

  conn->bits.do_more = TRUE;
  state(conn, FTP_STOP); /* this phase is completed */

  return result;
}